

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotErrorBarsH<signed_char>
               (char *label_id,char *xs,char *ys,char *neg,char *pos,int count,int offset,int stride
               )

{
  undefined1 local_68 [8];
  GetterError<signed_char> getter;
  int count_local;
  char *pos_local;
  char *neg_local;
  char *ys_local;
  char *xs_local;
  char *label_id_local;
  
  getter._44_4_ = count;
  GetterError<signed_char>::GetterError
            ((GetterError<signed_char> *)local_68,xs,ys,neg,pos,count,offset,stride);
  PlotErrorBarsHEx<ImPlot::GetterError<signed_char>>(label_id,(GetterError<signed_char> *)local_68);
  return;
}

Assistant:

void PlotErrorBarsH(const char* label_id, const T* xs, const T* ys, const T* neg, const T* pos, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, neg, pos, count, offset, stride);
    PlotErrorBarsHEx(label_id, getter);
}